

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

ChVector2<double> __thiscall
chrono::ChFile_ps::TransPt(ChFile_ps *this,ChVector2<double> *mfrom,Space space)

{
  undefined1 auVar1 [16];
  int in_ECX;
  undefined4 in_register_00000014;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVector2<double> CVar6;
  ChVector2<double> CVar7;
  ChVector2<double> local_18;
  
  puVar2 = (ulong *)CONCAT44(in_register_00000014,space);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *puVar2;
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar3 = vandpd_avx512vl(auVar4,auVar3);
  if (1e+20 < auVar3._0_8_) {
    *puVar2 = 0;
    auVar4 = ZEXT816(0);
  }
  local_18.m_data[0] = auVar4._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = puVar2[1];
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar3 = vandpd_avx512vl(auVar5,auVar1);
  if (1e+20 < auVar3._0_8_) {
    puVar2[1] = 0;
    auVar5 = ZEXT816(0);
  }
  local_18.m_data[1] = auVar5._0_8_;
  CVar6.m_data[1] = local_18.m_data[1];
  CVar6.m_data[0] = local_18.m_data[0];
  if (in_ECX == 1) {
    CVar6 = To_page_from_graph((ChFile_ps *)mfrom,&local_18);
  }
  else {
    (this->super_ChStreamOutAsciiFile).super_ChStreamFile._vptr_ChStreamFile =
         (_func_int **)local_18.m_data[0];
    *(double *)&(this->super_ChStreamOutAsciiFile).super_ChStreamFile.file = local_18.m_data[1];
  }
  CVar7.m_data[0] = CVar6.m_data[0];
  CVar7.m_data[1] = CVar6.m_data[1];
  return (ChVector2<double>)CVar7.m_data;
}

Assistant:

ChVector2<> ChFile_ps::TransPt(ChVector2<> mfrom, Space space) const {
    if ((mfrom.x() > 1.e+20) || (mfrom.x() < -1.e+20))
        mfrom.x() = 0;
    if ((mfrom.y() > 1.e+20) || (mfrom.y() < -1.e+20))
        mfrom.y() = 0;

    switch (space) {
        case Space::PAGE:
            return mfrom;
        case Space::GRAPH:
            return To_page_from_graph(mfrom);
        default:
            return mfrom;
    }
}